

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,QStringView needle,CaseSensitivity cs)

{
  bool bVar1;
  char32_t cVar2;
  long lVar3;
  int iVar4;
  size_t l;
  QChar *start;
  ulong uVar5;
  ulong uVar6;
  short sVar7;
  char16_t cVar8;
  char16_t cVar9;
  QChar *pQVar10;
  long lVar11;
  long lVar12;
  QChar *ch;
  QChar *pQVar13;
  QChar *ch_00;
  long lVar14;
  ulong uVar15;
  
  start = (QChar *)haystack.m_data;
  uVar5 = haystack.m_size;
  pQVar10 = (QChar *)needle.m_data;
  lVar14 = needle.m_size;
  if (lVar14 != 1) {
    uVar15 = (from >> 0x3f & uVar5) + from;
    if (uVar15 == uVar5 && lVar14 == 0) {
      return uVar15;
    }
    uVar6 = uVar5 - lVar14;
    if ((long)uVar6 < 0 || uVar5 < uVar15) {
      return -1;
    }
    if ((long)uVar15 < (long)uVar6) {
      uVar6 = uVar15;
    }
    pQVar13 = start + uVar6;
    uVar5 = 0;
    if (lVar14 != 0) {
      uVar5 = lVar14 - 1;
    }
    if (cs != CaseSensitive) {
      if (lVar14 < 1) {
        lVar12 = 0;
        lVar3 = 0;
      }
      else {
        ch_00 = pQVar10 + uVar5;
        ch = pQVar13 + uVar5;
        lVar3 = 0;
        lVar12 = 0;
        lVar11 = lVar14;
        do {
          cVar2 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(ch_00,pQVar10);
          lVar3 = (ulong)(uint)cVar2 + lVar3 * 2;
          cVar2 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(ch,start);
          lVar12 = (ulong)(uint)cVar2 + lVar12 * 2;
          ch = ch + -1;
          ch_00 = ch_00 + -1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      if ((long)uVar15 < 0) {
        return -1;
      }
      cVar2 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar13,start);
      lVar12 = lVar12 - (ulong)(uint)cVar2;
      lVar11 = uVar6 * 2;
      do {
        pQVar13 = (QChar *)((long)&start->ucs + lVar11);
        cVar2 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar13,start);
        lVar12 = (ulong)(uint)cVar2 + lVar12;
        if ((lVar12 == lVar3) &&
           (iVar4 = ucstricmp(lVar14,(char16_t *)pQVar13,lVar14,(char16_t *)pQVar10), iVar4 == 0)) {
          return lVar11 >> 1;
        }
        if (uVar5 < 0x40) {
          cVar2 = (anonymous_namespace)::foldCaseHelper<QChar_const*>
                            ((QChar *)((long)&start[lVar14 + -1].ucs + lVar11),start);
          lVar12 = lVar12 - ((ulong)(uint)cVar2 << ((byte)uVar5 & 0x3f));
        }
        lVar12 = lVar12 * 2;
        pQVar13 = (QChar *)((long)&start[-1].ucs + lVar11);
        lVar11 = lVar11 + -2;
      } while (start <= pQVar13);
      return -1;
    }
    if (lVar14 < 1) {
      lVar12 = 0;
      lVar3 = 0;
    }
    else {
      iVar4 = 1;
      if (lVar14 == 0) {
        iVar4 = (int)needle.m_size;
      }
      lVar3 = 0;
      lVar12 = 0;
      lVar11 = lVar14;
      do {
        lVar3 = (ulong)*(ushort *)((long)pQVar10 + (lVar11 * 2 - (ulong)(uint)(iVar4 * 2))) +
                lVar3 * 2;
        lVar12 = (ulong)*(ushort *)
                         ((long)start + lVar11 * 2 + (uVar6 * 2 - (ulong)(uint)(iVar4 * 2))) +
                 lVar12 * 2;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    if ((long)uVar15 < 0) {
      return -1;
    }
    lVar12 = lVar12 - (ulong)(ushort)pQVar13->ucs;
    do {
      lVar12 = (ulong)(ushort)pQVar13->ucs + lVar12;
      if (lVar12 == lVar3) {
        if (lVar14 == 0) {
LAB_0032f2a6:
          return (long)pQVar13 - (long)start >> 1;
        }
        lVar11 = 0;
        do {
          iVar4 = (uint)(ushort)pQVar10[lVar11].ucs - (uint)(ushort)pQVar13[lVar11].ucs;
          if (pQVar10[lVar11].ucs != pQVar13[lVar11].ucs) goto LAB_0032f19c;
          lVar11 = lVar11 + 1;
        } while (lVar14 != lVar11);
        iVar4 = 0;
LAB_0032f19c:
        if (iVar4 == 0) goto LAB_0032f2a6;
      }
      pQVar13 = pQVar13 + -1;
      if (uVar5 < 0x40) {
        lVar12 = lVar12 - ((ulong)(ushort)pQVar13[lVar14].ucs << ((byte)uVar5 & 0x3f));
      }
      lVar12 = lVar12 * 2;
      if (pQVar13 < start) {
        return -1;
      }
    } while( true );
  }
  if (uVar5 == 0) {
    return -1;
  }
  lVar14 = uVar5 - 1;
  if ((ulong)from <= uVar5) {
    lVar14 = from;
  }
  if (from < 0) {
    lVar14 = from + uVar5;
  }
  if (lVar14 < 0) {
    return -1;
  }
  cVar8 = pQVar10->ucs;
  if (cs == CaseSensitive) {
    lVar14 = lVar14 * 2;
    do {
      if (*(char16_t *)((long)&start->ucs + lVar14) == cVar8) goto LAB_0032f0c8;
      pQVar10 = (QChar *)((long)&start[-1].ucs + lVar14);
      lVar14 = lVar14 + -2;
    } while (start <= pQVar10);
  }
  else {
    sVar7 = (short)((uint)(int)(short)*(ushort *)
                                       (QUnicodeTables::uc_properties +
                                       (ulong)*(ushort *)
                                               (QUnicodeTables::uc_property_trie +
                                               (ulong)(((ushort)cVar8 & 0x1f) +
                                                      (uint)*(ushort *)
                                                             (QUnicodeTables::uc_property_trie +
                                                             (ulong)((ushort)cVar8 >> 5) * 2)) * 2)
                                       * 0x14 + 0xe) >> 1);
    if ((*(ushort *)
          (QUnicodeTables::uc_properties +
          (ulong)*(ushort *)
                  (QUnicodeTables::uc_property_trie +
                  (ulong)(((ushort)cVar8 & 0x1f) +
                         (uint)*(ushort *)
                                (QUnicodeTables::uc_property_trie + (ulong)((ushort)cVar8 >> 5) * 2)
                         ) * 2) * 0x14 + 0xe) & 1) == 0) {
      cVar8 = sVar7 + cVar8;
    }
    else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2) == 1) {
      cVar8 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2 + 2);
    }
    lVar14 = lVar14 * 2;
    do {
      cVar9 = *(char16_t *)((long)&start->ucs + lVar14);
      sVar7 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)(((ushort)cVar9 & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)((ushort)cVar9 >> 5) * 2)) * 2
                                                 ) * 0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((ushort)cVar9 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie +
                                  (ulong)((ushort)cVar9 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0) {
        cVar9 = sVar7 + cVar9;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2) == 1) {
        cVar9 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar7 * 2 + 2);
      }
      if (cVar9 == cVar8) goto LAB_0032f0c8;
      pQVar10 = (QChar *)((long)&start[-1].ucs + lVar14);
      lVar14 = lVar14 + -2;
    } while (start <= pQVar10);
  }
  bVar1 = true;
LAB_0032f0cd:
  if (bVar1) {
    return -1;
  }
  return lVar14;
LAB_0032f0c8:
  lVar14 = lVar14 >> 1;
  bVar1 = false;
  goto LAB_0032f0cd;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}